

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_flags_for_ground_items.hpp
# Opt level: O2

void __thiscall
PatchFlagsForGroundItems::add_mask_flags_for_already_taken_items
          (PatchFlagsForGroundItems *this,RandomizerWorld *world)

{
  pointer ppIVar1;
  ItemSourceOnGround *item_source;
  Item *pIVar2;
  pointer ppEVar3;
  bool bVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  pointer ppIVar6;
  pointer ppEVar7;
  Flag flag_source_already_taken;
  uint8_t local_40;
  
  ppIVar6 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar6 == ppIVar1) {
      return;
    }
    item_source = (ItemSourceOnGround *)*ppIVar6;
    bVar4 = ItemSource::is_ground_item((ItemSource *)item_source);
    if (bVar4) {
      pIVar2 = (item_source->super_ItemSource)._item;
      pvVar5 = &this->_finite_ground_items;
      if (pIVar2 == (Item *)0x0) {
        local_40 = '?';
      }
      else {
        local_40 = pIVar2->_id;
      }
LAB_0014edae:
      bVar4 = vectools::contains<unsigned_char>(pvVar5,(uchar *)&local_40);
      if (bVar4) {
        get_checked_flag_for_item_source((PatchFlagsForGroundItems *)&local_40,item_source);
        ppEVar3 = (item_source->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar7 = (item_source->_entities).
                       super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                       super__Vector_impl_data._M_start; ppEVar7 != ppEVar3; ppEVar7 = ppEVar7 + 1)
        {
          Entity::remove_when_flag_is_set(*ppEVar7,(Flag *)&local_40);
        }
      }
    }
    else {
      bVar4 = ItemSource::is_shop_item((ItemSource *)item_source);
      if (bVar4) {
        pIVar2 = (item_source->super_ItemSource)._item;
        pvVar5 = &this->_finite_shop_items;
        if (pIVar2 == (Item *)0x0) {
          local_40 = '?';
        }
        else {
          local_40 = pIVar2->_id;
        }
        goto LAB_0014edae;
      }
    }
    ppIVar6 = ppIVar6 + 1;
  } while( true );
}

Assistant:

void add_mask_flags_for_already_taken_items(RandomizerWorld& world)
    {
        for(ItemSource* item_source : world.item_sources())
        {
            if(item_source->is_ground_item())
            {
                if(!vectools::contains(_finite_ground_items, item_source->item_id()))
                    continue;
            }
            else if(item_source->is_shop_item())
            {
                if(!vectools::contains(_finite_shop_items, item_source->item_id()))
                    continue;
            }
            else continue; // Not a ground/shop item_source

            // If we reach this point, it means the item source contains an item that is considered as finite
            // and must be removed if already taken by the player
            ItemSourceOnGround* ground_source = reinterpret_cast<ItemSourceOnGround*>(item_source);
            Flag flag_source_already_taken = get_checked_flag_for_item_source(ground_source);
            for(Entity* entity : ground_source->entities())
                entity->remove_when_flag_is_set(flag_source_already_taken);
        }
    }